

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::watch_widget_pointer(Fl_Widget **w)

{
  long lVar1;
  int local_1c;
  int i;
  Fl_Widget **wp;
  Fl_Widget **w_local;
  
  local_1c = 0;
  while( true ) {
    if (num_widget_watch <= local_1c) {
      if (num_widget_watch == max_widget_watch) {
        max_widget_watch = max_widget_watch + 8;
        widget_watch = (Fl_Widget ***)realloc(widget_watch,(long)max_widget_watch << 3);
      }
      lVar1 = (long)num_widget_watch;
      num_widget_watch = num_widget_watch + 1;
      widget_watch[lVar1] = w;
      return;
    }
    if (widget_watch[local_1c] == w) break;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Fl::watch_widget_pointer(Fl_Widget *&w)
{
  Fl_Widget **wp = &w;
  int i;
  for (i=0; i<num_widget_watch; ++i) {
    if (widget_watch[i]==wp) return;
  }
  if (num_widget_watch==max_widget_watch) {
    max_widget_watch += 8;
    widget_watch = (Fl_Widget***)realloc(widget_watch, sizeof(Fl_Widget**)*max_widget_watch);
  }
  widget_watch[num_widget_watch++] = wp;
#ifdef DEBUG_WATCH
  printf ("\nwatch_widget_pointer:   (%d/%d) %8p => %8p\n",
    num_widget_watch,num_widget_watch,wp,*wp);
  fflush(stdout);
#endif // DEBUG_WATCH
}